

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

float Search::action_hamming_loss(action a,action *A,size_t sz)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  float fVar4;
  
  fVar4 = 0.0;
  if ((sz != 0) && (*A != a)) {
    uVar3 = 0;
    do {
      if (sz - 1 == uVar3) goto LAB_0025d3d5;
      uVar1 = uVar3 + 1;
      lVar2 = uVar3 + 1;
      uVar3 = uVar1;
    } while (A[lVar2] != a);
    if (sz <= uVar1) {
LAB_0025d3d5:
      fVar4 = 1.0;
    }
  }
  return fVar4;
}

Assistant:

float action_hamming_loss(action a, const action* A, size_t sz)
{
  if (sz == 0)
    return 0.;  // latent variables have zero loss
  for (size_t i = 0; i < sz; i++)
    if (a == A[i])
      return 0.;
  return 1.;
}